

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithms.h
# Opt level: O2

value_t __thiscall
pmean_filtration::compute_filtration
          (pmean_filtration *this,unsigned_short dimension,directed_flag_complex_cell_t *param_2,
          filtered_directed_graph_t *param_3,value_t *boundary_filtration)

{
  undefined6 in_register_00000032;
  value_t vVar1;
  value_t __x;
  float fVar2;
  unsigned_short local_2a;
  value_t *local_28;
  anon_class_16_2_11ccf446 local_20;
  
  local_2a = dimension;
  local_28 = boundary_filtration;
  vVar1 = max<float_const*>(boundary_filtration,0,(int)CONCAT62(in_register_00000032,dimension));
  local_20.dimension = &local_2a;
  local_20.boundary_filtration = &local_28;
  __x = compute_filtration::anon_class_16_2_11ccf446::operator()(&local_20);
  fVar2 = powf(__x,0.5);
  return fVar2 / ((float)local_2a + 1.0) + vVar1;
}

Assistant:

virtual inline value_t compute_filtration(unsigned short dimension, const directed_flag_complex_cell_t&,
	                                          const filtered_directed_graph_t&,
	                                          const value_t* boundary_filtration) const {
		return (max(boundary_filtration, 0, dimension) +
		        pow(
		            [&]() {
			            value_t EXPRESSION_0 = 0.0f;
			            for (int COUNTER_A = (int)0; COUNTER_A <= (int)dimension; COUNTER_A++) {
				            EXPRESSION_0 += (pow(boundary_filtration[COUNTER_A], 2.0f));
			            }
			            return EXPRESSION_0;
		            }(),
		            (1.0f / 2.0f)) /
		            (dimension + 1.0f));
	}